

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O0

int xmlCharEncInFunc(xmlCharEncodingHandler *handler,xmlBufferPtr out,xmlBufferPtr in)

{
  int local_74;
  char local_68 [8];
  char buf [50];
  int toconv;
  int written;
  int ret;
  xmlBufferPtr in_local;
  xmlBufferPtr out_local;
  xmlCharEncodingHandler *handler_local;
  
  if (handler == (xmlCharEncodingHandler *)0x0) {
    handler_local._4_4_ = -1;
  }
  else if (out == (xmlBufferPtr)0x0) {
    handler_local._4_4_ = -1;
  }
  else if (in == (xmlBufferPtr)0x0) {
    handler_local._4_4_ = -1;
  }
  else {
    buf._44_4_ = in->use;
    if (buf._44_4_ == 0) {
      handler_local._4_4_ = 0;
    }
    else {
      register0x00000000 = (out->size - out->use) + -1;
      if (register0x00000000 <= buf._44_4_ * 2) {
        xmlBufferGrow(out,out->size + buf._44_4_ * 2);
        register0x00000000 = (out->size - out->use) + -1;
      }
      toconv = xmlEncInputChunk(handler,out->content + out->use,(int *)(buf + 0x30),in->content,
                                (int *)(buf + 0x2c),1);
      xmlBufferShrink(in,buf._44_4_);
      out->use = stack0xffffffffffffffd0 + out->use;
      out->content[out->use] = '\0';
      if (toconv == -1) {
        toconv = -3;
      }
      switch(toconv) {
      case 0:
        break;
      case -3:
        break;
      case -2:
        snprintf(local_68,0x31,"0x%02X 0x%02X 0x%02X 0x%02X",(ulong)*in->content,
                 (ulong)in->content[1],(ulong)in->content[2],(uint)in->content[3]);
        buf[0x29] = '\0';
        xmlEncodingErr(XML_I18N_CONV_FAILED,"input conversion failed due to input error, bytes %s\n"
                       ,local_68);
        break;
      case -1:
      }
      if (toconv == -3) {
        toconv = 0;
      }
      if (stack0xffffffffffffffd0 == 0) {
        local_74 = toconv;
      }
      else {
        local_74 = stack0xffffffffffffffd0;
      }
      handler_local._4_4_ = local_74;
    }
  }
  return handler_local._4_4_;
}

Assistant:

int
xmlCharEncInFunc(xmlCharEncodingHandler * handler, xmlBufferPtr out,
                 xmlBufferPtr in)
{
    int ret;
    int written;
    int toconv;

    if (handler == NULL)
        return (-1);
    if (out == NULL)
        return (-1);
    if (in == NULL)
        return (-1);

    toconv = in->use;
    if (toconv == 0)
        return (0);
    written = out->size - out->use -1; /* count '\0' */
    if (toconv * 2 >= written) {
        xmlBufferGrow(out, out->size + toconv * 2);
        written = out->size - out->use - 1;
    }
    ret = xmlEncInputChunk(handler, &out->content[out->use], &written,
                           in->content, &toconv, 1);
    xmlBufferShrink(in, toconv);
    out->use += written;
    out->content[out->use] = 0;
    if (ret == -1)
        ret = -3;

    switch (ret) {
        case 0:
#ifdef DEBUG_ENCODING
            xmlGenericError(xmlGenericErrorContext,
                            "converted %d bytes to %d bytes of input\n",
                            toconv, written);
#endif
            break;
        case -1:
#ifdef DEBUG_ENCODING
            xmlGenericError(xmlGenericErrorContext,
                         "converted %d bytes to %d bytes of input, %d left\n",
                            toconv, written, in->use);
#endif
            break;
        case -3:
#ifdef DEBUG_ENCODING
            xmlGenericError(xmlGenericErrorContext,
                        "converted %d bytes to %d bytes of input, %d left\n",
                            toconv, written, in->use);
#endif
            break;
        case -2: {
            char buf[50];

	    snprintf(&buf[0], 49, "0x%02X 0x%02X 0x%02X 0x%02X",
		     in->content[0], in->content[1],
		     in->content[2], in->content[3]);
	    buf[49] = 0;
	    xmlEncodingErr(XML_I18N_CONV_FAILED,
		    "input conversion failed due to input error, bytes %s\n",
		           buf);
        }
    }
    /*
     * Ignore when input buffer is not on a boundary
     */
    if (ret == -3)
        ret = 0;
    return (written? written : ret);
}